

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode Curl_ftpsend(connectdata *conn,char *cmd)

{
  size_t sVar1;
  size_t *psStack_438;
  CURLcode result;
  char *sptr;
  size_t write_len;
  char s [1024];
  ssize_t bytes_written;
  char *cmd_local;
  connectdata *conn_local;
  
  psStack_438 = &write_len;
  sVar1 = strlen(cmd);
  if (sVar1 < 0x3fe) {
    strcpy(s + (sVar1 - 8),"\r\n");
    sptr = (char *)(sVar1 + 2);
    s[0x3f8] = '\0';
    s[0x3f9] = '\0';
    s[0x3fa] = '\0';
    s[0x3fb] = '\0';
    s[0x3fc] = '\0';
    s[0x3fd] = '\0';
    s[0x3fe] = '\0';
    s[0x3ff] = '\0';
    while (conn_local._4_4_ =
                Curl_write(conn,conn->sock[0],psStack_438,(size_t)sptr,(ssize_t *)(s + 0x3f8)),
          conn_local._4_4_ == CURLE_OK) {
      if (((conn->data->set).verbose & 1U) != 0) {
        Curl_debug(conn->data,CURLINFO_HEADER_OUT,(char *)psStack_438,s._1016_8_,conn);
      }
      if ((char *)s._1016_8_ == sptr) {
        return CURLE_OK;
      }
      sptr = sptr + -s._1016_8_;
      psStack_438 = (size_t *)(s._1016_8_ + (long)psStack_438);
    }
  }
  else {
    conn_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_ftpsend(struct connectdata *conn, const char *cmd)
{
  ssize_t bytes_written;
#define SBUF_SIZE 1024
  char s[SBUF_SIZE];
  size_t write_len;
  char *sptr = s;
  CURLcode result = CURLE_OK;
#ifdef HAVE_GSSAPI
  enum protection_level data_sec = conn->data_prot;
#endif

  write_len = strlen(cmd);
  if(write_len > (sizeof(s) -3))
    return CURLE_BAD_FUNCTION_ARGUMENT;

  strcpy(&s[write_len], "\r\n"); /* append a trailing CRLF */
  write_len += 2;
  bytes_written = 0;

  result = Curl_convert_to_network(conn->data, s, write_len);
  /* Curl_convert_to_network calls failf if unsuccessful */
  if(result)
    return result;

  for(;;) {
#ifdef HAVE_GSSAPI
    conn->data_prot = PROT_CMD;
#endif
    result = Curl_write(conn, conn->sock[FIRSTSOCKET], sptr, write_len,
                        &bytes_written);
#ifdef HAVE_GSSAPI
    DEBUGASSERT(data_sec > PROT_NONE && data_sec < PROT_LAST);
    conn->data_prot = data_sec;
#endif

    if(result)
      break;

    if(conn->data->set.verbose)
      Curl_debug(conn->data, CURLINFO_HEADER_OUT,
                 sptr, (size_t)bytes_written, conn);

    if(bytes_written != (ssize_t)write_len) {
      write_len -= bytes_written;
      sptr += bytes_written;
    }
    else
      break;
  }

  return result;
}